

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsIterationStaticSlices(void)

{
  uint uVar1;
  StaticSliceIterator<2UL> SVar2;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
  IVar6;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  Span<const_int,_18446744073709551615UL> span;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  pointer local_28;
  long lStack_20;
  undefined8 local_18;
  
  local_28 = (pointer)0x200000001;
  lStack_20 = 0x400000003;
  local_18 = 0x600000005;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_41);
  local_28 = (pointer)0x0;
  if ((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_28 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  lStack_20 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  IVar6 = MILBlob::Util::Span<int_const,18446744073709551615ul>::IterateSlices<2ul>
                    ((Span<int_const,18446744073709551615ul> *)&local_28);
  SVar2 = IVar6.m_begin.m_ptr;
  if (SVar2.m_ptr != IVar6.m_end.m_ptr.m_ptr) {
    uVar4 = 0;
    do {
      if (*SVar2.m_ptr != (uVar4 | 1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x24f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"(row.Get<0>()) == (counter + 1)",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
LAB_001c0c03:
        std::ostream::put((char)poVar3);
        iVar5 = 1;
        std::ostream::flush();
        goto LAB_001c0c1b;
      }
      uVar1 = ((uint *)SVar2.m_ptr)[1];
      if (uVar1 != uVar4 + 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x250);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"(row.Get<1>()) == (counter + 2)",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        goto LAB_001c0c03;
      }
      SVar2.m_ptr = SVar2.m_ptr + 2;
      uVar4 = uVar1;
    } while (SVar2.m_ptr != IVar6.m_end.m_ptr.m_ptr);
    iVar5 = 0;
    if (uVar1 == 6) goto LAB_001c0c1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
             ,0x71);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x254);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(counter) == (6)",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  iVar5 = 1;
  std::ostream::flush();
LAB_001c0c1b:
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int testSpanTestsIterationStaticSlices()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);

    // iterate 3 values at a time
    int counter = 0;
    for (auto row : span.IterateSlices<2>()) {
        ML_ASSERT_EQ(row.Size(), size_t(2));
        ML_ASSERT_EQ(row.Get<0>(), counter + 1);
        ML_ASSERT_EQ(row.Get<1>(), counter + 2);

        counter += 2;
    }
    ML_ASSERT_EQ(counter, 6);

    return 0;
}